

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O2

void Eigen::internal::treePostorder<int,Eigen::Matrix<int,_1,1,0,_1,1>>
               (int n,Matrix<int,__1,_1,_0,__1,_1> *parent,Matrix<int,__1,_1,_0,__1,_1> *post)

{
  int iVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  long size;
  ulong uVar4;
  Scalar local_74;
  Matrix<int,__1,_1,_0,__1,_1> *local_70;
  ulong local_68;
  DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *local_60;
  undefined1 auStack_58 [8];
  Matrix<int,__1,_1,_0,__1,_1> first_kid;
  Matrix<int,__1,_1,_0,__1,_1> next_kid;
  
  uVar4 = (ulong)(uint)n;
  auStack_58 = (undefined1  [8])0x0;
  first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  size = (long)(n + 1);
  local_60 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent;
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)auStack_58,size);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
             &first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ,size);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            (&post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size);
  local_74 = -1;
  local_70 = post;
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)auStack_58,&local_74);
  local_68 = uVar4;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (local_60,uVar4 & 0xffffffff);
    iVar1 = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)auStack_58,
                        (long)iVar1);
    SVar2 = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                        &first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,uVar4 & 0xffffffff);
    *pSVar3 = SVar2;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)auStack_58,
                        (long)iVar1);
    *pSVar3 = (Scalar)uVar4;
  }
  nr_etdfs<int,Eigen::Matrix<int,_1,1,0,_1,1>>
            ((int)local_68,(Matrix<int,__1,_1,_0,__1,_1> *)local_60,
             (Matrix<int,__1,_1,_0,__1,_1> *)auStack_58,
             (Matrix<int,__1,_1,_0,__1,_1> *)
             &first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ,local_70,0);
  free((void *)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  free((void *)auStack_58);
  return;
}

Assistant:

void treePostorder(Index n, IndexVector& parent, IndexVector& post)
{
  IndexVector first_kid, next_kid; // Linked list of children 
  Index postnum; 
  // Allocate storage for working arrays and results 
  first_kid.resize(n+1); 
  next_kid.setZero(n+1);
  post.setZero(n+1);
  
  // Set up structure describing children
  Index v, dad; 
  first_kid.setConstant(-1); 
  for (v = n-1; v >= 0; v--) 
  {
    dad = parent(v);
    next_kid(v) = first_kid(dad); 
    first_kid(dad) = v; 
  }
  
  // Depth-first search from dummy root vertex #n
  postnum = 0; 
  internal::nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
}